

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::SensitivityVisitor::visit(SensitivityVisitor *this,SequentialStmtBlock *stmt)

{
  VarType VVar1;
  pointer pEVar2;
  element_type *peVar3;
  StmtException *pSVar4;
  PortType type;
  pointer pEVar5;
  shared_ptr<kratos::Port> *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  IRNode *local_e8;
  element_type *local_e0;
  undefined1 auStack_d8 [8];
  shared_ptr<kratos::VarCasted> var_casted;
  string local_b8;
  string local_98;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_78;
  undefined1 local_50 [8];
  shared_ptr<kratos::Port> port;
  allocator_type local_31;
  
  pEVar5 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  do {
    if (pEVar5 == pEVar2) {
      return;
    }
    peVar3 = (element_type *)pEVar5->var;
    VVar1 = (peVar3->super_Var).type_;
    if (VVar1 == BaseCasted) {
      Var::as<kratos::VarCasted>((Var *)auStack_d8);
      if (((ulong)*(pointer *)((long)auStack_d8 + 0x280) & 0xfffffffe) != 2) {
        pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
        (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_b8,peVar3);
        local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_b8._M_dataplus._M_p;
        local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_b8._M_string_length;
        bVar6 = fmt::v7::to_string_view<char,_0>
                          (
                          "Only Clock and AsyncReset allowed in sensitivity list. Please use cast() to cast {0}}"
                          );
        format_str.data_ = (char *)bVar6.size_;
        format_str.size_ = 0xd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_78;
        fmt::v7::detail::vformat_abi_cxx11_(&local_98,(detail *)bVar6.data_,format_str,args);
        local_50 = (undefined1  [8])
                   port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
        __l._M_len = 2;
        __l._M_array = (iterator)local_50;
        port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)peVar3;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_78,__l,(allocator_type *)&local_e8);
        StmtException::StmtException(pSVar4,&local_98,&local_78);
        __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (shared_ptr<kratos::Port> *)&var_casted;
    }
    else {
      if (VVar1 != PortIO) {
        pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
        (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_b8,peVar3);
        local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_b8._M_dataplus._M_p;
        local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_b8._M_string_length;
        bVar6 = fmt::v7::to_string_view<char,_0>
                          (
                          "Only variable type of Clock and AsyncReset allowed in sensitivity list, got {0}"
                          );
        format_str_00.data_ = (char *)bVar6.size_;
        format_str_00.size_ = 0xd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_78;
        fmt::v7::detail::vformat_abi_cxx11_(&local_98,(detail *)bVar6.data_,format_str_00,args_00);
        auStack_d8 = (undefined1  [8])
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)auStack_d8;
        var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3
        ;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_78,__l_00,(allocator_type *)local_50);
        StmtException::StmtException(pSVar4,&local_98,&local_78);
        __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      Var::as<kratos::Port>((Var *)local_50);
      if (1 < *(int *)((long)local_50 + 0x274) - 1U) {
        pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
        (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_78,peVar3);
        port_type_to_str_abi_cxx11_
                  ((string *)auStack_d8,(kratos *)(ulong)*(uint *)((long)local_50 + 0x274),type);
        local_98._M_dataplus._M_p =
             (pointer)local_78.
                      super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        local_98._M_string_length =
             (size_type)
             local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_98.field_2._M_allocated_capacity = (size_type)auStack_d8;
        local_98.field_2._8_8_ =
             var_casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        bVar6 = fmt::v7::to_string_view<char,_0>
                          ("Only Clock and AsyncReset allowed in sensitivity list. {0} is {1}");
        format_str_01.data_ = (char *)bVar6.size_;
        format_str_01.size_ = 0xdd;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_98;
        fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)bVar6.data_,format_str_01,args_01);
        local_e8 = (IRNode *)
                   port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
        __l_01._M_len = 2;
        __l_01._M_array = &local_e8;
        local_e0 = peVar3;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)&local_98,__l_01,
                   &local_31);
        StmtException::StmtException
                  (pSVar4,&local_b8,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)&local_98);
        __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = &port;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        auto const& sensitivity_list = stmt->get_event_controls();
        for (auto const& iter : sensitivity_list) {
            auto* var = iter.var;
            // check type
            if (var->type() == VarType::PortIO) {
                // it's a port
                auto port = var->as<Port>();
                if (port->port_type() != PortType::Clock &&
                    port->port_type() != PortType::AsyncReset) {
                    // only clock and async reset allowed
                    throw StmtException(
                        ::format("Only Clock and AsyncReset allowed in "
                                 "sensitivity list. {0} is {1}",
                                 var->to_string(), port_type_to_str(port->port_type())),
                        {stmt, var});
                }
            } else if (var->type() == VarType::BaseCasted) {
                auto var_casted = var->as<VarCasted>();
                if (var_casted->cast_type() != VarCastType::Clock &&
                    var_casted->cast_type() != VarCastType::AsyncReset) {
                    throw StmtException(::format("Only Clock and AsyncReset allowed in "
                                                 "sensitivity list. Please use cast() to cast {0}}",
                                                 var->to_string()),
                                        {stmt, var});
                }
            } else {
                throw StmtException(::format("Only variable type of Clock and "
                                             "AsyncReset allowed in sensitivity list, got {0}",
                                             var->to_string()),
                                    {stmt, var});
            }
        }
    }